

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O0

void gen_lfdpx(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t uVar1;
  TCGv_i64 EA_00;
  TCGv_i64 val;
  TCGv_i64 t0;
  TCGv_i64 EA;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if (((ctx->fpu_enabled ^ 0xffU) & 1) == 0) {
    gen_set_access_type(ctx,0x30);
    EA_00 = tcg_temp_new_i64(tcg_ctx_00);
    gen_addr_reg_index(ctx,EA_00);
    val = tcg_temp_new_i64(tcg_ctx_00);
    if ((ctx->le_mode & 1U) == 0) {
      gen_qemu_ld64_i64(ctx,val,EA_00);
      uVar1 = rD(ctx->opcode);
      set_fpr(tcg_ctx_00,uVar1,val);
      tcg_gen_addi_i64_ppc64(tcg_ctx_00,EA_00,EA_00,8);
      gen_qemu_ld64_i64(ctx,val,EA_00);
      uVar1 = rD(ctx->opcode);
      set_fpr(tcg_ctx_00,uVar1 + 1,val);
    }
    else {
      gen_qemu_ld64_i64(ctx,val,EA_00);
      uVar1 = rD(ctx->opcode);
      set_fpr(tcg_ctx_00,uVar1 + 1,val);
      tcg_gen_addi_i64_ppc64(tcg_ctx_00,EA_00,EA_00,8);
      gen_qemu_ld64_i64(ctx,val,EA_00);
      uVar1 = rD(ctx->opcode);
      set_fpr(tcg_ctx_00,uVar1,val);
    }
    tcg_temp_free_i64(tcg_ctx_00,EA_00);
    tcg_temp_free_i64(tcg_ctx_00,val);
  }
  else {
    gen_exception(ctx,7);
  }
  return;
}

Assistant:

static void gen_lfdpx(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv EA;
    TCGv_i64 t0;
    if (unlikely(!ctx->fpu_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_FPU);
        return;
    }
    gen_set_access_type(ctx, ACCESS_FLOAT);
    EA = tcg_temp_new(tcg_ctx);
    gen_addr_reg_index(ctx, EA);
    t0 = tcg_temp_new_i64(tcg_ctx);
    /*
     * We only need to swap high and low halves. gen_qemu_ld64_i64
     * does necessary 64-bit byteswap already.
     */
    if (unlikely(ctx->le_mode)) {
        gen_qemu_ld64_i64(ctx, t0, EA);
        set_fpr(tcg_ctx, rD(ctx->opcode) + 1, t0);
        tcg_gen_addi_tl(tcg_ctx, EA, EA, 8);
        gen_qemu_ld64_i64(ctx, t0, EA);
        set_fpr(tcg_ctx, rD(ctx->opcode), t0);
    } else {
        gen_qemu_ld64_i64(ctx, t0, EA);
        set_fpr(tcg_ctx, rD(ctx->opcode), t0);
        tcg_gen_addi_tl(tcg_ctx, EA, EA, 8);
        gen_qemu_ld64_i64(ctx, t0, EA);
        set_fpr(tcg_ctx, rD(ctx->opcode) + 1, t0);
    }
    tcg_temp_free(tcg_ctx, EA);
    tcg_temp_free_i64(tcg_ctx, t0);
}